

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

double * getDWTmra(wt_object wt,double *wavecoeffs)

{
  int *length;
  int level;
  wave_object pwVar1;
  int iVar2;
  double *reccoeff;
  long lVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  level = wt->J;
  lVar6 = (long)level;
  iVar2 = wt->siglength;
  reccoeff = (double *)malloc((lVar6 + 1) * (long)iVar2 * 8);
  pwVar1 = wt->wave;
  length = wt->length;
  getDWTRecCoeff(wt->output,length,"appx",wt->ext,level,level,pwVar1->lpr,pwVar1->hpr,
                 pwVar1->lpr_len,iVar2,reccoeff);
  iVar2 = wt->siglength;
  lVar3 = 0;
  piVar4 = length;
  iVar5 = iVar2;
  for (; 0 < lVar6; lVar6 = lVar6 + -1) {
    lVar3 = (long)(int)lVar3 + (long)*piVar4;
    pwVar1 = wt->wave;
    getDWTRecCoeff(wt->output + lVar3,length,"det",wt->ext,(int)lVar6,level,pwVar1->lpr,pwVar1->hpr,
                   pwVar1->lpr_len,iVar2,reccoeff + iVar5);
    iVar2 = wt->siglength;
    iVar5 = iVar5 + iVar2;
    piVar4 = piVar4 + 1;
  }
  return reccoeff;
}

Assistant:

double *getDWTmra(wt_object wt, double *wavecoeffs) {
	int i, J, access,N;
	double *mra;
	J = wt->J;
	mra = (double*)malloc(sizeof(double)* wt->siglength*(J + 1));
	access = 0;
	

	// Approximation MRA
	getDWTRecCoeff(wt->output + access, wt->length, "appx", wt->ext, J, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra);

	// Details MRA
	N = wt->siglength;
	for (i = J; i > 0; --i) {
		access += wt->length[J - i];
		getDWTRecCoeff(wt->output + access, wt->length, "det", wt->ext, i, J, wt->wave->lpr, wt->wave->hpr, wt->wave->lpr_len, wt->siglength, mra+N);
		N += wt->siglength;
	}
	
	return mra;
}